

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef BinaryenRefI31(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  RefI31 *this;
  
  this = (RefI31 *)MixedArena::allocSpace(&module->allocator,0x18,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression._id = RefI31Id;
  this->value = value;
  (this->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression.type.id = 0x30;
  wasm::RefI31::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenRefI31(BinaryenModuleRef module,
                                     BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefI31((Expression*)value));
}